

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O2

void hash_set(void *data,char *key,char *value)

{
  int iVar1;
  size_t sVar2;
  undefined8 *puVar3;
  char *pcVar4;
  
  if (key != (char *)0x0) {
    puVar3 = (undefined8 *)data;
    if (value == (char *)0x0) {
      sVar2 = 0;
    }
    else {
      sVar2 = strlen(value);
      sVar2 = sVar2 + 1;
    }
    for (; puVar3 != (undefined8 *)0x0; puVar3 = (undefined8 *)puVar3[2]) {
      if (((char *)*puVar3 != (char *)0x0) && (iVar1 = strcmp((char *)*puVar3,key), iVar1 == 0)) {
        free((void *)puVar3[1]);
        if (value == (char *)0x0) {
          puVar3[1] = 0;
          return;
        }
        pcVar4 = (char *)malloc(sVar2);
        puVar3[1] = pcVar4;
        strcpy(pcVar4,value);
        return;
      }
    }
    puVar3 = (undefined8 *)malloc(0x18);
    if (value == (char *)0x0) {
      pcVar4 = (char *)0x0;
    }
    else {
      pcVar4 = (char *)malloc(sVar2);
      strcpy(pcVar4,value);
    }
    puVar3[1] = pcVar4;
    sVar2 = strlen(key);
    pcVar4 = (char *)malloc(sVar2 + 1);
    *puVar3 = pcVar4;
    strcpy(pcVar4,key);
    puVar3[2] = *(undefined8 *)((long)data + 0x10);
    *(undefined8 **)((long)data + 0x10) = puVar3;
  }
  return;
}

Assistant:

void hash_set(void *data, char *key, char *value) {
#ifdef DEBUG
	printf("hash_put([void *], %s, %s)...\n", key, value);
#endif
	linkedlist_t *map = (linkedlist_t *) data;

	if ( key == NULL ) {
#ifdef DEBUG
		printf("hash_put([void *], %s, %s)... DONE\n", key, value);
#endif
		return;
	}

	size_t length = 0;
	if ( value != NULL ) {
		length = strlen(value) + 1;
	}
	while ( map != NULL ) {
		if ( map->key != NULL && !strcmp(map->key, key) ) {
			if ( map->value != NULL ) {
				free(map->value);
			}
			if ( value != NULL ) {
				map->value = (char *) malloc(sizeof(char) * length);
				strcpy(map->value, value);
			} else {
				map->value = NULL;
			}
			return;
		}
		map = map->next;
	}

	linkedlist_t *element = (linkedlist_t *) malloc(sizeof(linkedlist_t));
	if ( value != NULL ) {
		element->value = (char *) malloc(sizeof(char) * length);
		strcpy(element->value, value);
	} else {
		element->value = NULL;
	}

	length = strlen(key) + 1;
	element->key = (char *) malloc(sizeof(char) * length);
	strcpy(element->key, key);

	map = (linkedlist_t *) data;
	element->next = map->next;
	map->next = element;
#ifdef DEBUG
	printf("hash_put([void *], %s, %s)... DONE\n", key, value);
#endif
}